

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

aiScene * aiImportFileExWithProperties(char *pFile,uint pFlags,aiFileIO *pFS,aiPropertyStore *props)

{
  ImporterPimpl *pIVar1;
  char *pcVar2;
  Importer *this;
  IOSystem *pIOHandler;
  aiScene *paVar3;
  char *__s;
  
  if (pFile != (char *)0x0) {
    this = (Importer *)operator_new(8);
    Assimp::Importer::Importer(this);
    if (props != (aiPropertyStore *)0x0) {
      pIVar1 = this->pimpl;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::operator=(&(pIVar1->mIntProperties)._M_t,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)props);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
      ::operator=(&(pIVar1->mFloatProperties)._M_t,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                   *)(props + 0x30));
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&(pIVar1->mStringProperties)._M_t,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(props + 0x60));
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
      ::operator=(&(pIVar1->mMatrixProperties)._M_t,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                   *)(props + 0x90));
    }
    if (pFS != (aiFileIO *)0x0) {
      pIOHandler = (IOSystem *)Assimp::Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (pIOHandler->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pIOHandler->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIOHandler->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIOHandler->_vptr_IOSystem = (_func_int **)&PTR__IOSystem_008c8010;
      pIOHandler[1]._vptr_IOSystem = (_func_int **)pFS;
      Assimp::Importer::SetIOHandler(this,pIOHandler);
    }
    paVar3 = Assimp::Importer::ReadFile(this,pFile,pFlags);
    if (paVar3 == (aiScene *)0x0) {
      __s = Assimp::Importer::GetErrorString(this);
      pcVar2 = _DAT_0099ae38;
      strlen(__s);
      std::__cxx11::string::_M_replace(0x99ae30,0,pcVar2,(ulong)__s);
      Assimp::Importer::~Importer(this);
      operator_delete(this,8);
      paVar3 = (aiScene *)0x0;
    }
    else {
      *(Importer **)paVar3->mPrivate = this;
    }
    return paVar3;
  }
  __assert_fail("__null != pFile",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0xa9,
                "const aiScene *aiImportFileExWithProperties(const char *, unsigned int, aiFileIO *, const aiPropertyStore *)"
               );
}

Assistant:

const aiScene* aiImportFileExWithProperties( const char* pFile, unsigned int pFlags, 
        aiFileIO* pFS, const aiPropertyStore* props) {
    ai_assert(NULL != pFile);

    const aiScene* scene = NULL;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // create an Importer for this file
    Assimp::Importer* imp = new Assimp::Importer();

    // copy properties
    if(props) {
        const PropertyMap* pp = reinterpret_cast<const PropertyMap*>(props);
        ImporterPimpl* pimpl = imp->Pimpl();
        pimpl->mIntProperties = pp->ints;
        pimpl->mFloatProperties = pp->floats;
        pimpl->mStringProperties = pp->strings;
        pimpl->mMatrixProperties = pp->matrices;
    }
    // setup a custom IO system if necessary
    if (pFS) {
        imp->SetIOHandler( new CIOSystemWrapper (pFS) );
    }

    // and have it read the file
    scene = imp->ReadFile( pFile, pFlags);

    // if succeeded, store the importer in the scene and keep it alive
    if( scene)  {
        ScenePrivateData* priv = const_cast<ScenePrivateData*>( ScenePriv(scene) );
        priv->mOrigImporter = imp;
    } else {
        // if failed, extract error code and destroy the import
        gLastErrorString = imp->GetErrorString();
        delete imp;
    }

    // return imported data. If the import failed the pointer is NULL anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    
    return scene;
}